

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QPoint __thiscall
QIconModeViewBase::initDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  long lVar1;
  bool bVar2;
  const_reference pQVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QListViewItem *item;
  int idx;
  int y;
  int x;
  qsizetype in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  QSize *in_stack_ffffffffffffffb0;
  QList<QListViewItem> *in_stack_ffffffffffffffc8;
  int local_2c;
  QPoint local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0x1c) == 0) {
    QRect::x((QRect *)0x8875af);
    QRect::y((QRect *)0x8875c5);
    QCommonListViewBase::rowCount((QCommonListViewBase *)(in_RDI + 0x60));
    QCommonListViewBase::hiddenCount((QCommonListViewBase *)0x8875f5);
    QList<QListViewItem>::reserve(in_stack_ffffffffffffffc8,in_stack_00000008);
  }
  else {
    local_2c = *(int *)(in_RSI + 0x1c);
    do {
      local_2c = local_2c + -1;
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
      if (0 < local_2c) {
        QList<QListViewItem>::at
                  ((QList<QListViewItem> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        bVar2 = QListViewItem::isValid
                          ((QListViewItem *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        in_stack_ffffffffffffffac = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac) ^ 0xff000000;
      }
    } while ((in_stack_ffffffffffffffac & 0x1000000) != 0);
    pQVar3 = QList<QListViewItem>::at
                       ((QList<QListViewItem> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    if (*(int *)(in_RSI + 0x28) == 0) {
      bVar2 = QSize::isValid(in_stack_ffffffffffffffb0);
      if (bVar2) {
        QSize::width((QSize *)0x8876ce);
      }
    }
    else {
      bVar2 = QSize::isValid(in_stack_ffffffffffffffb0);
      if (bVar2) {
        in_stack_ffffffffffffffa4 = QSize::height((QSize *)0x887719);
      }
      else {
        in_stack_ffffffffffffffa4 = (int)pQVar3->h;
      }
    }
  }
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QPoint QIconModeViewBase::initDynamicLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        x = info.bounds.x() + info.spacing;
        y = info.bounds.y() + info.spacing;
        items.reserve(rowCount() - hiddenCount());
    } else {
        int idx = info.first - 1;
        while (idx > 0 && !items.at(idx).isValid())
            --idx;
        const QListViewItem &item = items.at(idx);
        x = item.x;
        y = item.y;
        if (info.flow == QListView::LeftToRight)
            x += (info.grid.isValid() ? info.grid.width() : item.w) + info.spacing;
        else
            y += (info.grid.isValid() ? info.grid.height() : item.h) + info.spacing;
    }
    return QPoint(x, y);
}